

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFUnitIndex::Header::parse(Header *this,DataExtractor IndexData,uint64_t *OffsetPtr)

{
  uint32_t uVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((*OffsetPtr < 0xfffffffffffffff0) && (*OffsetPtr + 0xf < IndexData.Data.Length)) {
    uVar1 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->Version = uVar1;
    uVar1 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumColumns = uVar1;
    uVar1 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumUnits = uVar1;
    uVar1 = DataExtractor::getU32(&IndexData,OffsetPtr,(Error *)0x0);
    this->NumBuckets = uVar1;
    bVar2 = this->Version < 3;
  }
  return bVar2;
}

Assistant:

bool DWARFUnitIndex::Header::parse(DataExtractor IndexData,
                                   uint64_t *OffsetPtr) {
  if (!IndexData.isValidOffsetForDataOfSize(*OffsetPtr, 16))
    return false;
  Version = IndexData.getU32(OffsetPtr);
  NumColumns = IndexData.getU32(OffsetPtr);
  NumUnits = IndexData.getU32(OffsetPtr);
  NumBuckets = IndexData.getU32(OffsetPtr);
  return Version <= 2;
}